

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

void helper_neon_zip16_arm(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *vd;
  uVar2 = *vm;
  *(ulong *)vm = uVar2 & 0xffff000000000000 |
                 uVar1 >> 0x10 & 0xffff00000000 | uVar1 >> 0x20 & 0xffff |
                 (ulong)((uint)(uVar2 >> 0x10) & 0xffff0000);
  *(ulong *)vd = (ulong)((uint)uVar2 & 0xffff0000) << 0x20 |
                 (ulong)((uint)uVar1 & 0xffff0000) << 0x10 | uVar1 & 0xffff |
                 (ulong)((uint)uVar2 << 0x10);
  return;
}

Assistant:

void HELPER(neon_zip16)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd = rd[0], zm = rm[0];

    uint64_t d0 = ELEM(zd, 0, 16) | (ELEM(zm, 0, 16) << 16)
        | (ELEM(zd, 1, 16) << 32) | (ELEM(zm, 1, 16) << 48);
    uint64_t m0 = ELEM(zd, 2, 16) | (ELEM(zm, 2, 16) << 16)
        | (ELEM(zd, 3, 16) << 32) | (ELEM(zm, 3, 16) << 48);

    rm[0] = m0;
    rd[0] = d0;
}